

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.h
# Opt level: O0

node * __thiscall spsc_queue<int>::alloc_node(spsc_queue<int> *this)

{
  node *pnVar1;
  node **in_RDI;
  node *n;
  node *n_2;
  node *n_1;
  node *local_8;
  
  if (in_RDI[10] == in_RDI[0xb]) {
    pnVar1 = load_consume<spsc_queue<int>::node*>(in_RDI);
    in_RDI[0xb] = pnVar1;
    if (in_RDI[10] == in_RDI[0xb]) {
      local_8 = (node *)operator_new(0x10);
    }
    else {
      local_8 = in_RDI[10];
      in_RDI[10] = in_RDI[10]->next_;
    }
  }
  else {
    local_8 = in_RDI[10];
    in_RDI[10] = in_RDI[10]->next_;
  }
  return local_8;
}

Assistant:

node* alloc_node() 
  { 
      // first tries to allocate node from internal node cache, 
      // if attempt fails, allocates node via ::operator new() 

      if (first_ != tail_copy_) 
      { 
          node* n = first_; 
          first_ = first_->next_; 
          return n; 
      } 
      tail_copy_ = load_consume(&tail_); 
      if (first_ != tail_copy_) 
      { 
          node* n = first_; 
          first_ = first_->next_; 
          return n; 
      } 
      node* n = new node; 
      return n; 
  }